

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_upload(connectdata *conn)

{
  undefined8 *puVar1;
  SessionHandle *data_00;
  int __fd;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  int local_10c;
  char *pcStack_108;
  int readcount;
  char *buf2;
  stat file_stat;
  timeval now;
  curl_off_t bytecount;
  size_t nwrite;
  size_t nread;
  char *buf;
  SessionHandle *data;
  int local_30;
  CURLcode result;
  int mode;
  int fd;
  char *dir;
  FILEPROTO *file;
  connectdata *conn_local;
  
  puVar1 = (undefined8 *)(conn->data->req).protop;
  pcVar3 = strchr((char *)*puVar1,0x2f);
  data._4_4_ = CURLE_OK;
  data_00 = conn->data;
  pcVar4 = (data_00->state).buffer;
  now.tv_usec = 0;
  join_0x00000010_0x00000000_ = curlx_tvnow();
  (conn->data->req).upload_fromhere = pcVar4;
  if (pcVar3 == (char *)0x0) {
    conn_local._4_4_ = CURLE_FILE_COULDNT_READ_FILE;
  }
  else if (pcVar3[1] == '\0') {
    conn_local._4_4_ = CURLE_FILE_COULDNT_READ_FILE;
  }
  else {
    if ((data_00->state).resume_from == 0) {
      local_30 = 0x241;
    }
    else {
      local_30 = 0x441;
    }
    __fd = open64((char *)*puVar1,local_30,(conn->data->set).new_file_perms);
    if (__fd < 0) {
      Curl_failf(data_00,"Can\'t open %s for writing",*puVar1);
      conn_local._4_4_ = CURLE_WRITE_ERROR;
    }
    else {
      if ((data_00->state).infilesize != -1) {
        Curl_pgrsSetUploadSize(data_00,(data_00->state).infilesize);
      }
      if ((data_00->state).resume_from < 0) {
        iVar2 = fstat64(__fd,(stat64 *)&buf2);
        if (iVar2 != 0) {
          close(__fd);
          Curl_failf(data_00,"Can\'t get the size of %s",*puVar1);
          return CURLE_WRITE_ERROR;
        }
        (data_00->state).resume_from = file_stat.st_rdev;
      }
      while( true ) {
        if (((data._4_4_ != CURLE_OK) ||
            (data._4_4_ = Curl_fillreadbuffer(conn,0x4000,&local_10c), data._4_4_ != CURLE_OK)) ||
           (local_10c < 1)) goto LAB_008c1528;
        nwrite = (size_t)local_10c;
        pcStack_108 = pcVar4;
        if ((data_00->state).resume_from != 0) {
          if ((data_00->state).resume_from < (long)nwrite) {
            pcStack_108 = pcVar4 + (data_00->state).resume_from;
            nwrite = nwrite - (data_00->state).resume_from;
            (data_00->state).resume_from = 0;
          }
          else {
            (data_00->state).resume_from = (data_00->state).resume_from - nwrite;
            nwrite = 0;
          }
        }
        sVar5 = write(__fd,pcStack_108,nwrite);
        if (sVar5 != nwrite) break;
        now.tv_usec = nwrite + now.tv_usec;
        Curl_pgrsSetUploadCounter(data_00,now.tv_usec);
        iVar2 = Curl_pgrsUpdate(conn);
        if (iVar2 == 0) {
          data._4_4_ = Curl_speedcheck(data_00,stack0xffffffffffffff90);
        }
        else {
          data._4_4_ = CURLE_ABORTED_BY_CALLBACK;
        }
      }
      data._4_4_ = CURLE_SEND_ERROR;
LAB_008c1528:
      if ((data._4_4_ == CURLE_OK) && (iVar2 = Curl_pgrsUpdate(conn), iVar2 != 0)) {
        data._4_4_ = CURLE_ABORTED_BY_CALLBACK;
      }
      close(__fd);
      conn_local._4_4_ = data._4_4_;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode file_upload(struct connectdata *conn)
{
  struct FILEPROTO *file = conn->data->req.protop;
  const char *dir = strchr(file->path, DIRSEP);
  int fd;
  int mode;
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  char *buf = data->state.buffer;
  size_t nread;
  size_t nwrite;
  curl_off_t bytecount = 0;
  struct timeval now = Curl_tvnow();
  struct_stat file_stat;
  const char* buf2;

  /*
   * Since FILE: doesn't do the full init, we need to provide some extra
   * assignments here.
   */
  conn->data->req.upload_fromhere = buf;

  if(!dir)
    return CURLE_FILE_COULDNT_READ_FILE; /* fix: better error code */

  if(!dir[1])
    return CURLE_FILE_COULDNT_READ_FILE; /* fix: better error code */

#ifdef O_BINARY
#define MODE_DEFAULT O_WRONLY|O_CREAT|O_BINARY
#else
#define MODE_DEFAULT O_WRONLY|O_CREAT
#endif

  if(data->state.resume_from)
    mode = MODE_DEFAULT|O_APPEND;
  else
    mode = MODE_DEFAULT|O_TRUNC;

  fd = open(file->path, mode, conn->data->set.new_file_perms);
  if(fd < 0) {
    failf(data, "Can't open %s for writing", file->path);
    return CURLE_WRITE_ERROR;
  }

  if(-1 != data->state.infilesize)
    /* known size of data to "upload" */
    Curl_pgrsSetUploadSize(data, data->state.infilesize);

  /* treat the negative resume offset value as the case of "-" */
  if(data->state.resume_from < 0) {
    if(fstat(fd, &file_stat)) {
      close(fd);
      failf(data, "Can't get the size of %s", file->path);
      return CURLE_WRITE_ERROR;
    }
    else
      data->state.resume_from = (curl_off_t)file_stat.st_size;
  }

  while(!result) {
    int readcount;
    result = Curl_fillreadbuffer(conn, BUFSIZE, &readcount);
    if(result)
      break;

    if(readcount <= 0)  /* fix questionable compare error. curlvms */
      break;

    nread = (size_t)readcount;

    /*skip bytes before resume point*/
    if(data->state.resume_from) {
      if((curl_off_t)nread <= data->state.resume_from ) {
        data->state.resume_from -= nread;
        nread = 0;
        buf2 = buf;
      }
      else {
        buf2 = buf + data->state.resume_from;
        nread -= (size_t)data->state.resume_from;
        data->state.resume_from = 0;
      }
    }
    else
      buf2 = buf;

    /* write the data to the target */
    nwrite = write(fd, buf2, nread);
    if(nwrite != nread) {
      result = CURLE_SEND_ERROR;
      break;
    }

    bytecount += nread;

    Curl_pgrsSetUploadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, now);
  }
  if(!result && Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  close(fd);

  return result;
}